

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.cpp
# Opt level: O2

uint8_t * __thiscall pktalloc::Allocator::fallbackAllocate(Allocator *this,uint bytes)

{
  uint8_t *puVar1;
  int iVar2;
  
  iVar2 = (bytes + 0x1f >> 5) + 1;
  puVar1 = SIMDSafeAllocate((ulong)(uint)(iVar2 * 0x20));
  if (puVar1 == (uint8_t *)0x0) {
    puVar1 = (uint8_t *)0x0;
  }
  else {
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    *(int *)(puVar1 + 8) = iVar2;
    puVar1 = puVar1 + 0x20;
  }
  return puVar1;
}

Assistant:

uint8_t* Allocator::fallbackAllocate(unsigned bytes)
{
    // Calculate number of units required by this allocation
    // Note: +1 for the AllocationHeader
    const unsigned units = (bytes + kUnitSize - 1) / kUnitSize + 1;

    uint8_t* ptr = SIMDSafeAllocate(kUnitSize * units);
    if (!ptr) {
        return nullptr;
    }

    AllocationHeader* regionHeader = (AllocationHeader*)ptr;
#ifdef PKTALLOC_DEBUG
    regionHeader->Canary = AllocationHeader::kCanaryExpected;
#endif // PKTALLOC_DEBUG
    regionHeader->Header = nullptr;
    regionHeader->UsedUnits = units;

    return ptr + kUnitSize;
}